

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hawktracer.cpp
# Opt level: O0

void ht_listener_buffer_process_unserialized_events
               (HT_ListenerBuffer *buffer,TEventPtr events,size_t size,
               HT_ListenerFlushCallback flush_callback,void *listener)

{
  long *plVar1;
  long lVar2;
  HT_Event *event;
  size_t i;
  void *listener_local;
  HT_ListenerFlushCallback flush_callback_local;
  size_t size_local;
  TEventPtr events_local;
  HT_ListenerBuffer *buffer_local;
  
  if (buffer->max_size == 0) {
    __assert_fail("!HT_IS_BYPASS_MODE(buffer)",
                  "/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/build_O0/hawktracer.cpp"
                  ,0xaf7,
                  "void ht_listener_buffer_process_unserialized_events(HT_ListenerBuffer *, TEventPtr, size_t, HT_ListenerFlushCallback, void *)"
                 );
  }
  for (event = (HT_Event *)0x0; event < size;
      event = (HT_Event *)((long)&event->klass + *(long *)(*(long *)*plVar1 + 0x10))) {
    plVar1 = (long *)(events + (long)event);
    lVar2 = (**(code **)(*plVar1 + 0x10))(plVar1);
    if (buffer->max_size < lVar2 + buffer->usage) {
      ht_listener_buffer_flush(buffer,flush_callback,listener);
    }
    lVar2 = (**(code **)(*plVar1 + 8))(plVar1,buffer->data + buffer->usage);
    buffer->usage = lVar2 + buffer->usage;
  }
  return;
}

Assistant:

void
ht_listener_buffer_process_unserialized_events(HT_ListenerBuffer* buffer,
                                               TEventPtr events,
                                               size_t size,
                                               HT_ListenerFlushCallback flush_callback,
                                               void* listener)
{
    size_t i;

    assert(!HT_IS_BYPASS_MODE(buffer));

    for (i = 0; i < size;)
    {
        HT_Event* event = HT_EVENT(events + i);

        if (HT_EVENT_GET_KLASS(event)->get_size(event) + buffer->usage > buffer->max_size)
        {
            ht_listener_buffer_flush(buffer, flush_callback, listener);
        }

        buffer->usage += HT_EVENT_GET_KLASS(event)->serialize(event, buffer->data + buffer->usage);
        i += HT_EVENT_GET_KLASS(event)->type_info->size;
    }
}